

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-unwrap.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  FILE *pFVar1;
  undefined8 uVar2;
  EssenceType_t EVar3;
  FileReaderFactory defaultFactory;
  EssenceType_t EssenceType;
  CommandOptions Options;
  Result_t result;
  allocator<char> local_1ae;
  allocator<char> local_1ad;
  undefined1 local_1ac [4];
  undefined1 local_1a8 [104];
  size_type *local_140 [2];
  size_type local_130 [2];
  IFileReaderFactory local_120 [2];
  long local_110 [2];
  CommandOptions local_100;
  int local_70 [26];
  
  CommandOptions::CommandOptions(&local_100,argc,argv);
  pFVar1 = _stdout;
  if (local_100.version_flag == true) {
    uVar2 = ASDCP::Version();
    fprintf(pFVar1,
            "\n%s (asdcplib %s)\n\nCopyright (c) 2011-2018, Robert Scheler, Heiko Sparenberg Fraunhofer IIS, John Hurst\n\nasdcplib may be copied only under the terms of the license found at\nthe top of every file in the asdcplib distribution kit.\n\nSpecify the -h (help) option for further information about %s\n\n"
            ,"as-02-unwrap",uVar2,"as-02-unwrap");
  }
  pFVar1 = _stdout;
  if (local_100.help_flag == true) {
    fprintf(_stdout,
            "USAGE: %s [-h|-help] [-V]\n\n       %s [-1|-2] [-b <buffer-size>] [-d <duration>]\n       [-f <starting-frame>] [-m] [-p <frame-rate>] [-R] [-s <size>] [-v] [-W]\n       [-w] <input-file> [<file-prefix>]\n\n"
            ,"as-02-unwrap");
    fwrite("Options:\n  -1                - Split Wave essence to mono WAV files during extract.\n                      Default is multichannel WAV\n  -2                - Split Wave essence to stereo WAV files during extract.\n                      Default is multichannel WAV\n  -b <buffer-size>  - Specify size in bytes of picture frame buffer\n                      Defaults to 4,194,304 (4MB)\n  -d <duration>     - Number of frames to process, default all\n  -f <start-frame>  - Starting frame number, default 0\n  -g <SID>          - Extract the Generic Stream Partition payload\n  -h | -help        - Show help\n  -k <key-string>   - Use key for ciphertext operations\n  -m                - verify HMAC values when reading\n  -s <size>         - Number of bytes to dump to output when -v is given\n  -V                - Show version information\n  -v                - Verbose, prints informative messages to stderr\n  -W                - Read input file only, do not write destination file\n  -w <width>        - Width of numeric element in a series of frame file names\n                      (default 6)\n  -z                - Fail if j2c inputs have unequal parameters (default)\n  -Z                - Ignore unequal parameters in j2c inputs\n\n  NOTES: o There is no option grouping, all options must be distinct arguments.\n         o All option arguments must be separated from the option by whitespace.\n\n"
           ,0x566,1,pFVar1);
  }
  EVar3 = ESS_UNKNOWN;
  if ((local_100.version_flag != false) || (EVar3 = ESS_UNKNOWN, local_100.help_flag != false))
  goto LAB_0010b505;
  if (local_100.error_flag == true) {
    main_cold_2();
    EVar3 = ESS_PCM_24b_48k;
    goto LAB_0010b505;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1a8,local_100.input_filename,(allocator<char> *)local_140);
  ASDCP::EssenceType((string *)local_70,(EssenceType_t *)local_1a8,(IFileReaderFactory *)local_1ac);
  if ((undefined1 *)CONCAT44(local_1a8._4_4_,local_1a8._0_4_) != local_1a8 + 0x10) {
    operator_delete((undefined1 *)CONCAT44(local_1a8._4_4_,local_1a8._0_4_),local_1a8._16_8_ + 1);
  }
  if (local_70[0] < 0) {
LAB_0010b531:
    main_cold_1();
    EVar3 = local_1a8._0_4_;
  }
  else {
    switch(local_1ac) {
    case (undefined1  [4])0x9:
      read_JP2K_file((CommandOptions *)local_1a8,(IFileReaderFactory *)&local_100);
      Kumu::Result_t::operator=((Result_t *)local_70,(Result_t *)local_1a8);
      break;
    case (undefined1  [4])0xa:
    case (undefined1  [4])0xb:
      read_PCM_file((CommandOptions *)local_1a8,(IFileReaderFactory *)&local_100);
      Kumu::Result_t::operator=((Result_t *)local_70,(Result_t *)local_1a8);
      break;
    case (undefined1  [4])0xc:
      read_timed_text_file((CommandOptions *)local_1a8,(IFileReaderFactory *)&local_100);
      Kumu::Result_t::operator=((Result_t *)local_70,(Result_t *)local_1a8);
      break;
    case (undefined1  [4])0xd:
      if (local_100.g_stream_sid == 0) {
        read_isxd_file((CommandOptions *)local_1a8,(IFileReaderFactory *)&local_100);
        Kumu::Result_t::operator=((Result_t *)local_70,(Result_t *)local_1a8);
        break;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_140,local_100.input_filename,&local_1ad);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_120,local_100.file_prefix,&local_1ae);
      extract_generic_stream_partition_payload
                ((string *)local_1a8,(ui32_t)local_140,(string *)(ulong)(uint)local_100.g_stream_sid
                 ,local_120);
      Kumu::Result_t::operator=((Result_t *)local_70,(Result_t *)local_1a8);
      Kumu::Result_t::~Result_t((Result_t *)local_1a8);
      if (local_120[0]._vptr_IFileReaderFactory != (_func_int **)local_110) {
        operator_delete(local_120[0]._vptr_IFileReaderFactory,local_110[0] + 1);
      }
      if (local_140[0] != local_130) {
        operator_delete(local_140[0],local_130[0] + 1);
      }
      goto LAB_0010b4ec;
    case (undefined1  [4])0xe:
      read_ACES_file((CommandOptions *)local_1a8,(IFileReaderFactory *)&local_100);
      Kumu::Result_t::operator=((Result_t *)local_70,(Result_t *)local_1a8);
      break;
    case (undefined1  [4])0xf:
      read_iab_file((CommandOptions *)local_1a8,(IFileReaderFactory *)&local_100);
      Kumu::Result_t::operator=((Result_t *)local_70,(Result_t *)local_1a8);
      break;
    default:
      fprintf(_stderr,"%s: Unknown file type (%d), not AS-02 essence.\n",local_100.input_filename);
      EVar3 = ESS_TIMED_TEXT;
      goto LAB_0010b4f8;
    }
    Kumu::Result_t::~Result_t((Result_t *)local_1a8);
LAB_0010b4ec:
    EVar3 = ESS_UNKNOWN;
    if (local_70[0] < 0) goto LAB_0010b531;
  }
LAB_0010b4f8:
  Kumu::Result_t::~Result_t((Result_t *)local_70);
LAB_0010b505:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.prefix_buffer._M_dataplus._M_p != &local_100.prefix_buffer.field_2) {
    operator_delete(local_100.prefix_buffer._M_dataplus._M_p,
                    local_100.prefix_buffer.field_2._M_allocated_capacity + 1);
  }
  return EVar3;
}

Assistant:

int
main(int argc, const char** argv)
{
  CommandOptions Options(argc, argv);

  if ( Options.version_flag )
    banner();

  if ( Options.help_flag )
    usage();

  if ( Options.version_flag || Options.help_flag )
    return 0;

  if ( Options.error_flag )
    {
      fprintf(stderr, "There was a problem. Type %s -h for help.\n", PROGRAM_NAME);
      return 3;
    }

  EssenceType_t EssenceType;
  Kumu::FileReaderFactory defaultFactory;
  Result_t result = ASDCP::EssenceType(Options.input_filename, EssenceType, defaultFactory);

  if ( ASDCP_SUCCESS(result) )
    {
      switch ( EssenceType )
	{
	case ESS_AS02_JPEG_2000:
	  result = read_JP2K_file(Options, defaultFactory);
	  break;
	//PB
	case ESS_AS02_ACES:
	  result = read_ACES_file(Options, defaultFactory);
	  break;
	//--
	case ESS_AS02_PCM_24b_48k:
	case ESS_AS02_PCM_24b_96k:
	  result = read_PCM_file(Options, defaultFactory);
	  break;

	case ESS_AS02_TIMED_TEXT:
	  result = read_timed_text_file(Options, defaultFactory);
	  break;

    case ESS_AS02_IAB:
	  result = read_iab_file(Options, defaultFactory);
	  break;

	case ESS_AS02_ISXD:
	  if ( Options.g_stream_sid == 0 )
	    {
          result = read_isxd_file(Options, defaultFactory);
	    }
	  else
	    {
	      result = extract_generic_stream_partition_payload(Options.input_filename,
								Options.g_stream_sid,
                                Options.file_prefix, defaultFactory);
	    }
	  break;

	default:
	  fprintf(stderr, "%s: Unknown file type (%d), not AS-02 essence.\n", Options.input_filename, EssenceType);
	  return 5;
	}
    }

  if ( ASDCP_FAILURE(result) )
    {
      fputs("Program stopped on error.\n", stderr);

      if ( result != RESULT_FAIL )
	{
	  fputs(result, stderr);
	  fputc('\n', stderr);
	}

      return 1;
    }

  return 0;
}